

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

Vector3 __thiscall xatlas::internal::Mesh::computeFaceCenter(Mesh *this,uint32_t face)

{
  Array<xatlas::internal::Vector3> *this_00;
  uint *puVar1;
  Vector3 *b;
  Vector3 *a;
  Vector3 *a_00;
  Array<unsigned_int> *this_01;
  float fVar2;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar3 [16];
  float in_XMM1_Db;
  float fVar4;
  Vector3 VVar5;
  Vector3 VVar6;
  Vector3 VVar7;
  Vector3 VVar8;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  Vector3 local_48;
  undefined8 local_38;
  
  this_00 = &this->m_positions;
  this_01 = &this->m_indices;
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3);
  b = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 1);
  a = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 2);
  a_00 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  VVar5 = operator-(a,b);
  fVar2 = in_XMM1_Db;
  VVar6 = operator-(a_00,a);
  fVar4 = VVar6.y;
  local_68 = VVar5.x;
  fStack_64 = VVar5.y;
  fStack_60 = (float)extraout_XMM0_Qb;
  fStack_5c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  auVar3._0_4_ = VVar5.z * VVar5.z + local_68 * local_68 + fStack_64 * fStack_64;
  auVar3._4_4_ = VVar6.z * VVar6.z + VVar6.x * VVar6.x + fVar4 * fVar4;
  auVar3._8_4_ = in_XMM1_Db * in_XMM1_Db + fStack_64 * fStack_64 + fStack_60 * fStack_60;
  auVar3._12_4_ = fVar2 * fVar2 + fVar4 * fVar4 + fStack_5c * fStack_5c;
  auVar3 = sqrtps(auVar3,auVar3);
  VVar5 = operator-(b,a_00);
  fVar2 = SQRT(VVar5.z * VVar5.z + VVar5.x * VVar5.x + VVar5.y * VVar5.y);
  VVar5 = operator+(b,a);
  local_78 = auVar3._0_4_;
  fStack_74 = auVar3._4_4_;
  local_48.z = VVar5.z * local_78;
  local_48.y = local_78 * VVar5.y;
  local_48.x = local_78 * VVar5.x;
  fVar4 = local_78 + fStack_74 + fVar2;
  VVar5 = operator/(&local_48,fVar4);
  local_38 = VVar5._0_8_;
  VVar6 = operator+(a,a_00);
  local_48.x = VVar6.x * fStack_74;
  local_48.y = VVar6.y * fStack_74;
  local_48.z = VVar6.z * fStack_74;
  VVar6 = operator/(&local_48,fVar4);
  VVar7 = operator+(a_00,b);
  local_48.z = VVar7.z * fVar2;
  local_48.y = fVar2 * VVar7.y;
  local_48.x = fVar2 * VVar7.x;
  VVar7 = operator/(&local_48,fVar4);
  local_58 = VVar6.x;
  fStack_54 = VVar6.y;
  VVar8.x = VVar7.x + local_58 + (float)local_38;
  VVar8.y = VVar7.y + fStack_54 + local_38._4_4_;
  VVar8.z = VVar7.z + VVar6.z + VVar5.z;
  return VVar8;
}

Assistant:

Vector3 computeFaceCenter(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const float l0 = length(p1 - p0);
		const float l1 = length(p2 - p1);
		const float l2 = length(p0 - p2);
		const Vector3 m0 = (p0 + p1) * l0 / (l0 + l1 + l2);
		const Vector3 m1 = (p1 + p2) * l1 / (l0 + l1 + l2);
		const Vector3 m2 = (p2 + p0) * l2 / (l0 + l1 + l2);
		return m0 + m1 + m2;
	}